

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_add_element(Integer s_a,Integer idx,Integer jdx,void *val)

{
  long lVar1;
  size_t __n;
  void *pvVar2;
  long lVar3;
  Integer *pIVar4;
  Integer *pIVar5;
  void *pvVar6;
  void *in_RCX;
  Integer in_RDX;
  Integer in_RSI;
  long in_RDI;
  Integer me;
  char *oval;
  char *tval;
  Integer *tjdx;
  Integer *tidx;
  Integer i;
  Integer idx_size;
  Integer size;
  Integer nval;
  Integer hdl;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  long local_48;
  
  lVar3 = in_RDI + 1000;
  lVar1 = SPA[lVar3].nval;
  __n = SPA[lVar3].size;
  if (SPA[lVar3].active == 0) {
    pnga_error(in_stack_00000130,in_stack_00000128);
  }
  if (SPA[lVar3].ready != 0) {
    pnga_error(in_stack_00000130,in_stack_00000128);
  }
  if (SPA[lVar3].maxval <= lVar1) {
    pvVar2 = SPA[lVar3].val;
    pnga_pgroup_nodeid(SPA[lVar3].grp);
    pIVar4 = (Integer *)malloc(SPA[lVar3].maxval << 4);
    pIVar5 = (Integer *)malloc(SPA[lVar3].maxval << 4);
    pvVar6 = malloc(SPA[lVar3].maxval * 2 * SPA[lVar3].size);
    for (local_48 = 0; local_48 < lVar1; local_48 = local_48 + 1) {
      pIVar4[local_48] = SPA[lVar3].idx[local_48];
      pIVar5[local_48] = SPA[lVar3].jdx[local_48];
      memcpy((void *)((long)pvVar6 + local_48 * __n),(void *)((long)pvVar2 + local_48 * __n),__n);
    }
    free(SPA[lVar3].idx);
    free(SPA[lVar3].jdx);
    free(SPA[lVar3].val);
    SPA[lVar3].idx = pIVar4;
    SPA[lVar3].jdx = pIVar5;
    SPA[lVar3].val = pvVar6;
    SPA[lVar3].maxval = SPA[lVar3].maxval << 1;
  }
  SPA[lVar3].idx[lVar1] = in_RSI;
  SPA[lVar3].jdx[lVar1] = in_RDX;
  memcpy((void *)((long)SPA[lVar3].val + __n * lVar1),in_RCX,__n);
  SPA[lVar3].nval = SPA[lVar3].nval + 1;
  return;
}

Assistant:

void pnga_sprs_array_add_element(Integer s_a, Integer idx, Integer jdx, void *val)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nval = SPA[hdl].nval;
  Integer size = SPA[hdl].size;
  Integer idx_size = sizeof(Integer);
  /* Check to see if array is active and not ready */
  if (!SPA[hdl].active) 
    pnga_error("(ga_sprs_array_add_element) Array not active",hdl);
  if (SPA[hdl].ready) 
    pnga_error("(ga_sprs_array_add_element) Array is already distributed",hdl);
  /* Check to see if existing buffers can hold another value. If not, then
   * create new buffers that are twice as large and copy old data to new
   * buffers*/
  if (nval >= SPA[hdl].maxval) {
    Integer i;
    Integer *tidx;
    Integer *tjdx;
    char *tval;
    char *oval = (char*)SPA[hdl].val;
    Integer me = pnga_pgroup_nodeid(SPA[hdl].grp);

    tidx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tjdx = (Integer*)malloc(2*SPA[hdl].maxval*sizeof(Integer));
    tval = (char*)malloc(2*SPA[hdl].maxval*SPA[hdl].size);
    /* copy data in old arrays to new, larger array */
    for (i=0; i<nval; i++) {
      tidx[i] = SPA[hdl].idx[i];
      tjdx[i] = SPA[hdl].jdx[i];
      memcpy((tval+i*size),(oval+i*size),(size_t)size);
    }
    /* get rid of old arrays */
    free(SPA[hdl].idx);
    free(SPA[hdl].jdx);
    free(SPA[hdl].val);
    /* re-assign local buffers */
    SPA[hdl].idx = tidx;
    SPA[hdl].jdx = tjdx;
    SPA[hdl].val = tval;
    /* add new values */
    SPA[hdl].maxval = 2*SPA[hdl].maxval;
  }
  /* add new value to buffers */
  SPA[hdl].idx[nval] = idx;
  SPA[hdl].jdx[nval] = jdx;
  memcpy((char*)SPA[hdl].val+size*nval,(char*)val,(size_t)size);
  SPA[hdl].nval++;
}